

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O3

Id dxil_spv::build_naturally_extended_value(Impl *impl,Value *value,uint bits,bool is_signed)

{
  Id IVar1;
  TypeID TVar2;
  uint value_00;
  Id type_id;
  uint uVar3;
  Type *pTVar4;
  Builder *this;
  Operation *this_00;
  
  IVar1 = Converter::Impl::get_id_for_value(impl,value,0);
  pTVar4 = LLVMBC::Value::getType(value);
  TVar2 = LLVMBC::Type::getTypeID(pTVar4);
  if (TVar2 == IntegerTyID) {
    pTVar4 = LLVMBC::Value::getType(value);
    value_00 = LLVMBC::Type::getIntegerBitWidth(pTVar4);
    if ((0x3f < value_00 - 1) ||
       (uVar3 = value_00, (0x8000000080008081U >> ((ulong)(value_00 - 1) & 0x3f) & 1) == 0)) {
      uVar3 = (uint)(0x20 < value_00) * 0x20 + 0x20;
    }
    if (bits != 0) {
      value_00 = bits;
    }
    if (value_00 != uVar3) {
      this = Converter::Impl::builder(impl);
      pTVar4 = LLVMBC::Value::getType(value);
      type_id = Converter::Impl::get_type_id(impl,pTVar4,0);
      this_00 = Converter::Impl::allocate(impl,is_signed ^ OpBitFieldUExtract,type_id);
      Operation::add_id(this_00,IVar1);
      IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar1 = spv::Builder::makeIntConstant(this,IVar1,0,false);
      Operation::add_id(this_00,IVar1);
      IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar1 = spv::Builder::makeIntConstant(this,IVar1,value_00,false);
      Operation::add_id(this_00,IVar1);
      Converter::Impl::add(impl,this_00,false);
      IVar1 = this_00->id;
    }
  }
  return IVar1;
}

Assistant:

static spv::Id build_naturally_extended_value(Converter::Impl &impl, const llvm::Value *value,
                                              unsigned bits, bool is_signed)
{
	spv::Id id = impl.get_id_for_value(value);
	if (value->getType()->getTypeID() != llvm::Type::TypeID::IntegerTyID)
		return id;

	auto logical_bits = value->getType()->getIntegerBitWidth();
	auto physical_bits = physical_integer_bit_width(logical_bits);

	if (bits == 0)
		bits = logical_bits;
	if (bits == physical_bits)
		return id;

	auto &builder = impl.builder();
	auto *mask_op = impl.allocate(is_signed ? spv::OpBitFieldSExtract : spv::OpBitFieldUExtract,
	                              impl.get_type_id(value->getType()));
	mask_op->add_id(id);
	mask_op->add_id(builder.makeUintConstant(0));
	mask_op->add_id(builder.makeUintConstant(bits));
	impl.add(mask_op);
	return mask_op->id;
}